

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter.hpp
# Opt level: O1

string * __thiscall
CLI::Formatter::make_subcommands_abi_cxx11_
          (string *__return_storage_ptr__,Formatter *this,App *app,AppFormatMode mode)

{
  App *pAVar1;
  pointer pcVar2;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var3;
  ostream *poVar4;
  pointer pbVar5;
  pointer ppAVar6;
  pointer ppAVar7;
  string group_key;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subcmd_groups_seen;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands_group;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> subcommands;
  stringstream out;
  _Any_data local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  string *local_230;
  Formatter *local_228;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_220;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_208;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  App *local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  local_268.field_2._12_4_ = mode;
  local_230 = __return_storage_ptr__;
  local_228 = this;
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  local_268._M_dataplus._M_p = (pointer)0x0;
  local_268._M_string_length = 0;
  local_278._M_unused._M_object =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_278._8_8_ = 0;
  local_1c8 = app;
  App::get_subcommands(&local_208,app,(function<bool_(const_CLI::App_*)> *)&local_278);
  if ((code *)local_268._M_dataplus._M_p != (code *)0x0) {
    (*(code *)local_268._M_dataplus._M_p)(&local_278,&local_278,3);
  }
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_248.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_208.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_208.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppAVar6 = local_208.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      pAVar1 = *ppAVar6;
      if ((pAVar1->name_)._M_string_length == 0) {
        if ((pAVar1->group_)._M_string_length != 0) {
          (*(local_228->super_FormatterBase)._vptr_FormatterBase[7])(&local_278);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,(char *)local_278._M_unused._0_8_,local_278._8_8_);
          goto LAB_00148c08;
        }
      }
      else {
        pcVar2 = (pAVar1->group_)._M_dataplus._M_p;
        local_278._M_unused._M_object = &local_268;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_278,pcVar2,pcVar2 + (pAVar1->group_)._M_string_length);
        if ((local_278._8_8_ != 0) &&
           (_Var3 = ::std::
                    __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_pred<CLI::Formatter::make_subcommands(CLI::App_const*,CLI::AppFormatMode)const::_lambda(std::__cxx11::string)_1_>>
                              (local_248.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,
                               local_248.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish,&local_278),
           _Var3._M_current ==
           local_248.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish)) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_248,(value_type *)&local_278);
        }
LAB_00148c08:
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_278._M_unused._0_8_ != &local_268) {
          operator_delete(local_278._M_unused._M_object,(size_t)(local_268._M_dataplus._M_p + 1));
        }
      }
      ppAVar6 = ppAVar6 + 1;
    } while (ppAVar6 !=
             local_208.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  local_1d0 = local_248.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_248.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar5 = local_248.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
      poVar4 = ::std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,(pbVar5->_M_dataplus)._M_p,pbVar5->_M_string_length);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar4,":\n",2);
      local_278._8_8_ = 0;
      local_268._M_string_length =
           (size_type)
           std::
           _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/cli11-src/include/CLI/Formatter.hpp:193:13)>
           ::_M_invoke;
      local_268._M_dataplus._M_p =
           (pointer)std::
                    _Function_handler<bool_(const_CLI::App_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O1/_deps/cli11-src/include/CLI/Formatter.hpp:193:13)>
                    ::_M_manager;
      local_278._M_unused._0_8_ = (undefined8)pbVar5;
      App::get_subcommands(&local_220,local_1c8,(function<bool_(const_CLI::App_*)> *)&local_278);
      ppAVar7 = local_220.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      local_1c0 = pbVar5;
      ppAVar6 = local_220.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      if ((code *)local_268._M_dataplus._M_p != (code *)0x0) {
        (*(code *)local_268._M_dataplus._M_p)(&local_278,&local_278,3);
        ppAVar7 = local_220.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        ppAVar6 = local_220.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      for (; ppAVar7 != ppAVar6; ppAVar7 = ppAVar7 + 1) {
        pAVar1 = *ppAVar7;
        if ((pAVar1->name_)._M_string_length != 0) {
          if (local_268.field_2._12_4_ == All) {
            local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
            pcVar2 = (pAVar1->name_)._M_dataplus._M_p;
            ::std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1f0,pcVar2,pcVar2 + (pAVar1->name_)._M_string_length);
            App::help((string *)&local_278,pAVar1,&local_1f0,Sub);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_278._M_unused._0_8_,local_278._8_8_);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_278._M_unused._0_8_ != &local_268) {
              operator_delete(local_278._M_unused._M_object,(size_t)(local_268._M_dataplus._M_p + 1)
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
              operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
          }
          else {
            (*(local_228->super_FormatterBase)._vptr_FormatterBase[6])(&local_278,local_228,pAVar1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_278._M_unused._0_8_,local_278._8_8_);
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                local_278._M_unused._0_8_ != &local_268) {
              operator_delete(local_278._M_unused._M_object,(size_t)(local_268._M_dataplus._M_p + 1)
                             );
            }
          }
        }
      }
      if (local_220.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_220.
                        super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_220.
                              super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_220.
                              super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      pbVar5 = local_1c0 + 1;
    } while (pbVar5 != local_1d0);
  }
  ::std::__cxx11::stringbuf::str();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_248);
  if (local_208.super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_208.
                    super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_208.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_208.
                          super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return local_230;
}

Assistant:

inline std::string Formatter::make_subcommands(const App *app, AppFormatMode mode) const {
    std::stringstream out;

    std::vector<const App *> subcommands = app->get_subcommands({});

    // Make a list in definition order of the groups seen
    std::vector<std::string> subcmd_groups_seen;
    for(const App *com : subcommands) {
        if(com->get_name().empty()) {
            if(!com->get_group().empty()) {
                out << make_expanded(com);
            }
            continue;
        }
        std::string group_key = com->get_group();
        if(!group_key.empty() &&
           std::find_if(subcmd_groups_seen.begin(), subcmd_groups_seen.end(), [&group_key](std::string a) {
               return detail::to_lower(a) == detail::to_lower(group_key);
           }) == subcmd_groups_seen.end())
            subcmd_groups_seen.push_back(group_key);
    }

    // For each group, filter out and print subcommands
    for(const std::string &group : subcmd_groups_seen) {
        out << "\n" << group << ":\n";
        std::vector<const App *> subcommands_group = app->get_subcommands(
            [&group](const App *sub_app) { return detail::to_lower(sub_app->get_group()) == detail::to_lower(group); });
        for(const App *new_com : subcommands_group) {
            if(new_com->get_name().empty())
                continue;
            if(mode != AppFormatMode::All) {
                out << make_subcommand(new_com);
            } else {
                out << new_com->help(new_com->get_name(), AppFormatMode::Sub);
                out << "\n";
            }
        }
    }

    return out.str();
}